

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedCollator::adoptTailoring
          (RuleBasedCollator *this,CollationTailoring *t,UErrorCode *errorCode)

{
  CollationSettings *this_00;
  CollationCacheEntry *this_01;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this_01 = (CollationCacheEntry *)UMemory::operator_new((UMemory *)0x100,(size_t)t);
    if (this_01 != (CollationCacheEntry *)0x0) {
      CollationCacheEntry::CollationCacheEntry(this_01,&t->actualLocale,t);
      this->cacheEntry = this_01;
      this->data = t->data;
      this_00 = t->settings;
      this->settings = this_00;
      SharedObject::addRef(&this_00->super_SharedObject);
      this->tailoring = t;
      SharedObject::addRef(&this->cacheEntry->super_SharedObject);
      Locale::operator=(&this->validLocale,&t->actualLocale);
      this->actualLocaleIsSameAsValid = '\0';
      return;
    }
    this->cacheEntry = (CollationCacheEntry *)0x0;
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  SharedObject::deleteIfZeroRefCount(&t->super_SharedObject);
  return;
}

Assistant:

void
RuleBasedCollator::adoptTailoring(CollationTailoring *t, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        t->deleteIfZeroRefCount();
        return;
    }
    U_ASSERT(settings == NULL && data == NULL && tailoring == NULL && cacheEntry == NULL);
    cacheEntry = new CollationCacheEntry(t->actualLocale, t);
    if(cacheEntry == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        t->deleteIfZeroRefCount();
        return;
    }
    data = t->data;
    settings = t->settings;
    settings->addRef();
    tailoring = t;
    cacheEntry->addRef();
    validLocale = t->actualLocale;
    actualLocaleIsSameAsValid = FALSE;
}